

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_headers.h
# Opt level: O1

void __thiscall
cppcms::impl::response_headers::
format_cgi_headers<cppcms::impl::response_headers::string_buffer_wrapper>
          (response_headers *this,string_buffer_wrapper *io,bool complete)

{
  response_headers *prVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = *(_Rb_tree_node_base **)(this + 0x18); p_Var2 != (_Rb_tree_node_base *)(this + 8);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::__cxx11::string::_M_append((char *)io,*(ulong *)(p_Var2 + 1));
    std::__cxx11::string::append((char *)io);
    std::__cxx11::string::_M_append((char *)io,*(ulong *)(p_Var2 + 2));
    std::__cxx11::string::append((char *)io);
  }
  for (prVar1 = *(response_headers **)(this + 0x30); prVar1 != this + 0x30;
      prVar1 = *(response_headers **)prVar1) {
    std::__cxx11::string::_M_append((char *)io,*(ulong *)(prVar1 + 0x10));
    std::__cxx11::string::append((char *)io);
  }
  if (complete) {
    std::__cxx11::string::append((char *)io);
    return;
  }
  return;
}

Assistant:

void format_cgi_headers(IODevice &io,bool complete) const
	{
		for(auto p=std::begin(headers_),e=std::end(headers_);p!=e;++p) {
			io << p->first << ": " << p->second << "\r\n";
		}
		for(auto const &h: added_headers_) {
			io <<  h << "\r\n" ;
		}
		if(complete)
			io << "\r\n";
	}